

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_if.cc
# Opt level: O0

unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>_>
 __thiscall absl::lts_20240722::time_internal::cctz::TimeZoneIf::Make(TimeZoneIf *this,string *name)

{
  int iVar1;
  undefined1 local_58 [24];
  string local_40;
  undefined1 local_20 [16];
  string *name_local;
  
  local_20._8_8_ = name;
  name_local = (string *)this;
  iVar1 = std::__cxx11::string::compare((ulong)name,0,(char *)0x5);
  if (iVar1 == 0) {
    std::__cxx11::string::substr((ulong)(local_58 + 0x18),local_20._8_8_);
    TimeZoneLibC::Make((TimeZoneLibC *)local_20,(string *)(local_58 + 0x18));
    std::
    unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneIf,std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>>
    ::
    unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneLibC,std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneLibC>,void>
              ((unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneIf,std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>>
                *)this,(unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneLibC>_>
                        *)local_20);
    std::
    unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneLibC>_>
    ::~unique_ptr((unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneLibC,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneLibC>_>
                   *)local_20);
    std::__cxx11::string::~string((string *)(local_58 + 0x18));
  }
  else {
    TimeZoneInfo::Make((TimeZoneInfo *)local_58,(string *)local_20._8_8_);
    std::
    unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneIf,std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>>
    ::
    unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneInfo,std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneInfo>,void>
              ((unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneIf,std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>>
                *)this,(unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneInfo>_>
                        *)local_58);
    std::
    unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneInfo>_>
    ::~unique_ptr((unique_ptr<absl::lts_20240722::time_internal::cctz::TimeZoneInfo,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneInfo>_>
                   *)local_58);
  }
  return (__uniq_ptr_data<absl::lts_20240722::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>,_true,_true>
          )(__uniq_ptr_data<absl::lts_20240722::time_internal::cctz::TimeZoneIf,_std::default_delete<absl::lts_20240722::time_internal::cctz::TimeZoneIf>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<TimeZoneIf> TimeZoneIf::Make(const std::string& name) {
  // Support "libc:localtime" and "libc:*" to access the legacy
  // localtime and UTC support respectively from the C library.
  // NOTE: The "libc:*" zones are internal, test-only interfaces, and
  // are subject to change/removal without notice. Do not use them.
  if (name.compare(0, 5, "libc:") == 0) {
    return TimeZoneLibC::Make(name.substr(5));
  }

  // Otherwise use the "zoneinfo" implementation.
  return TimeZoneInfo::Make(name);
}